

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2Impl::norm16HasDecompBoundaryBefore(Normalizer2Impl *this,uint16_t norm16)

{
  bool bVar1;
  
  bVar1 = true;
  if (this->minNoNoCompNoMaybeCC <= norm16) {
    if (norm16 < this->limitNoNo) {
      if ((*(byte *)((long)this->extraData + (ulong)(norm16 & 0xfffe)) & 0x80) != 0) {
        return this->extraData[(ulong)(norm16 >> 1) - 1] < 0x100;
      }
    }
    else {
      bVar1 = norm16 == 0xfe00 || norm16 < 0xfc01;
    }
  }
  return bVar1;
}

Assistant:

UBool Normalizer2Impl::norm16HasDecompBoundaryBefore(uint16_t norm16) const {
    if (norm16 < minNoNoCompNoMaybeCC) {
        return TRUE;
    }
    if (norm16 >= limitNoNo) {
        return norm16 <= MIN_NORMAL_MAYBE_YES || norm16 == JAMO_VT;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    // TRUE if leadCC==0 (hasFCDBoundaryBefore())
    return (firstUnit&MAPPING_HAS_CCC_LCCC_WORD)==0 || (*(mapping-1)&0xff00)==0;
}